

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfile.h
# Opt level: O1

void __thiscall CVmFile::write_str_byte_prefix(CVmFile *this,char *str,size_t len)

{
  char b [1];
  char local_19;
  
  if (len < 0x100) {
    local_19 = (char)len;
    write_bytes(this,&local_19,1);
    write_bytes(this,str,len);
    return;
  }
  err_throw(0x66);
}

Assistant:

void write_str_byte_prefix(const char *str, size_t len)
    {
        /* make sure it fits */
        if (len > 255)
            err_throw(VMERR_WRITE_FILE);

        /* write the prefix and the string */
        write_byte((char)len);
        write_bytes(str, len);
    }